

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuSloppyState::reset(QMenuSloppyState *this)

{
  bool bVar1;
  
  this->m_init_guard = false;
  this->m_first_mouse = true;
  this->field_0x6c = this->field_0x6c & 0xde | 0x20;
  this->m_uni_dir_discarded_count = 0;
  QBasicTimer::stop();
  (this->m_action_rect).w = 0.0;
  (this->m_action_rect).h = 0.0;
  (this->m_action_rect).xp = 0.0;
  (this->m_action_rect).yp = 0.0;
  this->m_reset_action = (QAction *)0x0;
  this->m_origin_action = (QAction *)0x0;
  (this->m_previous_point).xp = 0.0;
  (this->m_previous_point).yp = 0.0;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->m_sub_menu);
  if (bVar1) {
    *(undefined8 *)(*(long *)((this->m_sub_menu).wp.value + 8) + 0x380) = 0;
    QWeakPointer<QObject>::assign<QObject>(&(this->m_sub_menu).wp,(QObject *)0x0);
    return;
  }
  return;
}

Assistant:

void QMenuSloppyState::reset()
{
    m_enabled = false;
    m_first_mouse = true;
    m_init_guard = false;
    m_use_reset_action = true;
    m_uni_dir_discarded_count = 0;
    m_time.stop();
    m_reset_action = nullptr;
    m_origin_action = nullptr;
    m_action_rect = QRect();
    m_previous_point = QPointF();
    if (m_sub_menu) {
        QMenuPrivate::get(m_sub_menu)->sloppyState.m_parent = nullptr;
        m_sub_menu = nullptr;
    }
}